

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O1

void __thiscall
portability_path_test_portability_path_test_canonical_middle_double_dot_Test::TestBody
          (portability_path_test_portability_path_test_canonical_middle_double_dot_Test *this)

{
  undefined8 *puVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer *__ptr;
  char *pcVar3;
  AssertionResult gtest_ar;
  string_path canonical;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1048;
  AssertHelper local_1040;
  internal local_1038 [8];
  undefined8 *local_1030;
  char local_1028 [4104];
  
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           portability_path_canonical("../a/b/../c",0xc,local_1028,0x1000);
  local_1048._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_1048._M_head_impl._4_4_ << 0x20);
  local_1040.data_._0_4_ = strcmp(local_1028,"a/c");
  testing::internal::CmpHelperEQ<int,int>
            (local_1038,"(int)0","(int)strcmp(canonical, result)",(int *)&local_1048,
             (int *)&local_1040);
  if (local_1038[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1048);
    if (local_1030 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_1030;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1040,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x1e2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1040,(Message *)&local_1048);
    testing::internal::AssertHelper::~AssertHelper(&local_1040);
    if (local_1048._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1048._M_head_impl + 8))();
    }
  }
  puVar1 = local_1030;
  if (local_1030 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1030 != local_1030 + 2) {
      operator_delete((undefined8 *)*local_1030);
    }
    operator_delete(puVar1);
  }
  local_1040.data_ = (AssertHelperData *)0x4;
  local_1048._M_head_impl = pbVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_1038,"(size_t)size","(size_t)sizeof(result)",(unsigned_long *)&local_1048,
             (unsigned_long *)&local_1040);
  if (local_1038[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1048);
    if (local_1030 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_1030;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1040,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x1e3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1040,(Message *)&local_1048);
    testing::internal::AssertHelper::~AssertHelper(&local_1040);
    if (local_1048._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1048._M_head_impl + 8))();
    }
  }
  puVar1 = local_1030;
  if (local_1030 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1030 != local_1030 + 2) {
      operator_delete((undefined8 *)*local_1030);
    }
    operator_delete(puVar1);
  }
  local_1048._M_head_impl = local_1048._M_head_impl & 0xffffffffffffff00;
  local_1040.data_._0_1_ = "../a/b/../c"[(long)(pbVar2 + 0xb)];
  testing::internal::CmpHelperEQ<char,char>
            (local_1038,"(char)\'\\0\'","(char)result[size - 1]",(char *)&local_1048,
             (char *)&local_1040);
  if (local_1038[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1048);
    if (local_1030 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_1030;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1040,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x1e4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1040,(Message *)&local_1048);
    testing::internal::AssertHelper::~AssertHelper(&local_1040);
    if (local_1048._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1048._M_head_impl + 8))();
    }
  }
  if (local_1030 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_1030 != local_1030 + 2) {
      operator_delete((undefined8 *)*local_1030);
    }
    operator_delete(local_1030);
  }
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_canonical_middle_double_dot)
{
	static const char path[] = "../a/b/../c";
	static const char result[] = "a/c";

	string_path canonical;

	size_t size = portability_path_canonical(path, sizeof(path), canonical, PATH_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(canonical, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}